

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O1

void prngSTBStart(void *state,u16 *z)

{
  long lVar1;
  u16 uVar2;
  
  lVar1 = 4;
  do {
    if (z == (u16 *)0x0) {
      uVar2 = (short)lVar1 - 3;
    }
    else {
      uVar2 = z[lVar1 + -4];
    }
    *(u16 *)((long)state + lVar1 * 2) = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x23);
  *(undefined4 *)((long)state + 0x46) = 0;
  *(undefined8 *)state = 0;
  lVar1 = 0x100;
  do {
    _prngSTBClock((prng_stb_st *)state);
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  return;
}

Assistant:

void prngSTBStart(void* state, const u16 z[31])
{
	prng_stb_st* s = (prng_stb_st*)state;
	size_t i;
	// pre
	ASSERT(memIsValid(s, sizeof(prng_stb_st)));
	ASSERT(memIsNullOrValid(z, 2 * 31));
	// загрузить z
	for (i = 0; i < 31; ++i)
	{
		s->z[i] = z ? z[i] : (u16)(i + 1);
		ASSERT(s->z[i] > 0 && s->z[i] < 65257);
	}
	// настроить состояние
	s->v = s->w = 0;
	s->i = 0;
	// холостой ход
	for (i = 0; i < 256; ++i)
		_prngSTBClock(s);
}